

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O3

int get_framename(frameex1 *fx_addr68k)

{
  uint uVar1;
  
  uVar1 = (&fx_addr68k->fnheader)[(ulong)((fx_addr68k->field_0x3 & 2) >> 1) * 2];
  if ((uVar1 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
  }
  return *(uint *)(Lisp_world + (ulong)uVar1 + 4) & 0xfffffff;
}

Assistant:

int get_framename(struct frameex1 *fx_addr68k) {
  struct fnhead *fnheader;
  LispPTR scratch;

/* Get FNHEAD */
#ifdef BIGVM
  if (fx_addr68k->validnametable == 0) {
    scratch = (unsigned int)(fx_addr68k->fnheader);
  } else {
    scratch = (unsigned int)(fx_addr68k->nametable);
  }
#else
  if (fx_addr68k->validnametable == 0) {
    scratch = (unsigned int)(fx_addr68k->hi2fnheader << 16);
    scratch |= (unsigned int)(fx_addr68k->lofnheader);
  } else {
    scratch = (unsigned int)(fx_addr68k->hi2nametable << 16);
    scratch |= (unsigned int)(fx_addr68k->lonametable);
  }
#endif /* BIGVM */
  fnheader = (struct fnhead *)NativeAligned4FromLAddr(scratch);
  return (fnheader->framename);
}